

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t *
Gia_ManDupFromVecs(Gia_Man_t *p,Vec_Int_t *vCis,Vec_Int_t *vAnds,Vec_Int_t *vCos,int nRegs)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  int iVar5;
  
  p_00 = Gia_ManStart(5000);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < vCis->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vCis,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar2 = Gia_ManAppendCi(p_00);
    pGVar4->Value = uVar2;
  }
  for (iVar5 = 0; iVar5 < vAnds->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vAnds,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    iLit1 = Gia_ObjFanin1Copy(pGVar4);
    uVar2 = Gia_ManAppendAnd(p_00,iVar1,iLit1);
    pGVar4->Value = uVar2;
  }
  for (iVar5 = 0; iVar5 < vCos->nSize; iVar5 = iVar5 + 1) {
    iVar1 = Vec_IntEntry(vCos,iVar5);
    pGVar4 = Gia_ManObj(p,iVar1);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar1 = Gia_ObjFanin0Copy(pGVar4);
    uVar2 = Gia_ManAppendCo(p_00,iVar1);
    pGVar4->Value = uVar2;
  }
  Gia_ManSetRegNum(p_00,nRegs);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupFromVecs( Gia_Man_t * p, Vec_Int_t * vCis, Vec_Int_t * vAnds, Vec_Int_t * vCos, int nRegs )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    // start the new manager
    pNew = Gia_ManStart( 5000 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create constant
    Gia_ManConst0(p)->Value = 0;
    // create PIs
    Gia_ManForEachObjVec( vCis, p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create internal nodes
    Gia_ManForEachObjVec( vAnds, p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // create ROs
    Gia_ManForEachObjVec( vCos, p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, nRegs );
    return pNew;
}